

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O2

void __thiscall HighsSimplexAnalysis::invertReport(HighsSimplexAnalysis *this,bool header)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  stringstream *this_00;
  undefined8 local_40 [4];
  
  this_00 = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(this_00);
  pbVar1 = (this->analysis_log)._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  (this->analysis_log)._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00
  ;
  if (pbVar1 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)pbVar1 + 8))();
  }
  reportAlgorithmPhase(this,header);
  reportIterationObjective(this,header);
  if (this->analyse_simplex_runtime_data == true) {
    if (this->simplex_strategy == 3) {
      reportThreads(this,header);
      reportMulti(this,header);
    }
    reportDensity(this,header);
  }
  reportInfeasibility(this,header);
  reportInvert(this,header);
  std::__cxx11::stringbuf::str();
  highsLogDev(&this->log_options,kInfo,"%s\n",local_40[0]);
  std::__cxx11::string::~string((string *)local_40);
  if (!header) {
    this->num_invert_report_since_last_header = this->num_invert_report_since_last_header + 1;
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::invertReport(const bool header) {
  analysis_log = std::unique_ptr<std::stringstream>(new std::stringstream());
  reportAlgorithmPhase(header);
  reportIterationObjective(header);
  if (analyse_simplex_runtime_data) {
    if (simplex_strategy == kSimplexStrategyDualMulti) {
      // Report on threads and PAMI
      reportThreads(header);
      reportMulti(header);
    }
    reportDensity(header);
    //  reportCondition(header);
  }
  reportInfeasibility(header);
  //  if (analyse_simplex_runtime_data)
  reportInvert(header);
  highsLogDev(log_options, HighsLogType::kInfo, "%s\n",
              analysis_log->str().c_str());
  if (!header) num_invert_report_since_last_header++;
}